

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall
BackwardPass::ProcessSymUse(BackwardPass *this,Sym *sym,bool isRegOpndUse,BOOLEAN isNonByteCodeUse)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  pBVar1 = this->currentBlock;
  bVar3 = CanDeadStoreInstrForScopeObjRemoval(this,sym);
  if (bVar3) {
    return false;
  }
  if (sym->m_kind != SymKindStack) {
    if (sym->m_kind == SymKindProperty) {
      ProcessStackSymUse(this,(StackSym *)sym[1].m_next,isNonByteCodeUse);
      if (this->isCollectionPass != false) {
        return true;
      }
      bVar3 = DoDeadStoreSlots(this);
      if (bVar3) {
        BVSparse<Memory::JitArenaAllocator>::Clear(pBVar1->slotDeadStoreCandidates,sym->m_id);
      }
      if (this->tag != BackwardPhase) {
        return false;
      }
      bVar3 = ProcessPropertySymUse(this,(PropertySym *)sym);
      return bVar3;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = ProcessStackSymUse(this,(StackSym *)sym,isNonByteCodeUse);
  return bVar3;
}

Assistant:

bool
BackwardPass::ProcessSymUse(Sym * sym, bool isRegOpndUse, BOOLEAN isNonByteCodeUse)
{
    BasicBlock * block = this->currentBlock;

    if (CanDeadStoreInstrForScopeObjRemoval(sym))
    {
        return false;
    }

    if (sym->IsPropertySym())
    {
        PropertySym * propertySym = sym->AsPropertySym();
        ProcessStackSymUse(propertySym->m_stackSym, isNonByteCodeUse);

        if(IsCollectionPass())
        {
            return true;
        }

        if (this->DoDeadStoreSlots())
        {
            block->slotDeadStoreCandidates->Clear(propertySym->m_id);
        }

        if (tag == Js::BackwardPhase)
        {
            // Backward phase tracks liveness of fields to tell GlobOpt where we may need bailout.
            return this->ProcessPropertySymUse(propertySym);
        }
        else
        {
            // Dead-store phase tracks copy propped syms, so it only cares about ByteCodeUses we inserted,
            // not live fields.
            return false;
        }
    }

    return ProcessStackSymUse(sym->AsStackSym(), isNonByteCodeUse);
}